

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void hermite_poly_phys_coef(int n,double *c)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  
  if (-1 < n) {
    uVar2 = (ulong)(uint)n;
    uVar1 = uVar2 + 1;
    uVar3 = 0;
    uVar5 = uVar1;
    pdVar4 = c;
    pdVar8 = c;
    do {
      do {
        *pdVar4 = 0.0;
        uVar5 = uVar5 - 1;
        pdVar4 = pdVar4 + uVar2 + 1;
      } while (uVar5 != 0);
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar8 + 1;
      uVar5 = uVar1;
      pdVar8 = pdVar4;
    } while (uVar3 != uVar1);
    *c = 1.0;
    if ((n != 0) && (c[uVar2 + 2] = 2.0, 1 < n)) {
      uVar2 = (ulong)(n + 1U);
      pdVar4 = c + 1;
      uVar5 = 2;
      lVar6 = 0;
      do {
        dVar9 = (double)(int)(uVar5 - 1) * -2.0;
        c[uVar5] = c[uVar5 - 2] * dVar9;
        lVar7 = lVar6;
        pdVar8 = pdVar4;
        if (2 < uVar5) {
          do {
            pdVar8[uVar2 + 1] = *pdVar8 + *pdVar8 + pdVar8[uVar2 - 1] * dVar9;
            lVar7 = lVar7 + -1;
            pdVar8 = pdVar8 + uVar2;
          } while (lVar7 != 0);
        }
        c[uVar5 + (long)(int)(((int)uVar5 + -1) * (n + 1U))] =
             c[uVar5 + (uVar5 - 2) * uVar2 + -1] + c[uVar5 + (uVar5 - 2) * uVar2 + -1];
        c[(int)((n + 2U) * (int)uVar5)] =
             c[(uVar5 - 1) * (ulong)(n + 2U)] + c[(uVar5 - 1) * (ulong)(n + 2U)];
        uVar5 = uVar5 + 1;
        pdVar4 = pdVar4 + 1;
        lVar6 = lVar6 + 1;
      } while (uVar5 != (uVar1 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void hermite_poly_phys_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_POLY_PHYS_COEF: coefficients of the physicist's Hermite polynomial H(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     2
//     2     -2     0      4
//     3      0   -12      0      8
//     4     12     0    -48      0      16
//     5      0   120      0   -160       0    32
//     6   -120     0    720      0    -480     0     64
//     7      0 -1680      0   3360       0 -1344      0   128
//     8   1680     0 -13440      0   13440     0  -3584     0    256
//     9      0 30240      0 -80640       0 48384      0 -9216      0 512
//    10 -30240     0 302400      0 -403200     0 161280     0 -23040   0 1024
//
//  Recursion:
//
//    H(0,X) = 1,
//    H(1,X) = 2*X,
//    H(N,X) = 2*X * H(N-1,X) - 2*(N-1) * H(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Hermite
//    polynomials.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 2.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)] = - 2.0 * double( i - 1 ) * c[i-2+0*(n+1)];
    for ( j = 1; j <= i-2; j++ )
    {
      c[i+j*(n+1)] =   2.0 * c[i-1+(j-1)*(n+1)] 
                     - 2.0 * double( i - 1 ) * c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] =  2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] =  2.0 * c[i-1+(i-1)*(n+1)];
  }

  return;
}